

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

void __thiscall OpenTypeFileInput::OpenTypeFileInput(OpenTypeFileInput *this)

{
  OpenTypeFileInput *this_local;
  
  CFFFileInput::CFFFileInput(&this->mCFF);
  OpenTypePrimitiveReader::OpenTypePrimitiveReader
            (&this->mPrimitivesReader,(IByteReaderWithPosition *)0x0);
  std::
  map<unsigned_long,_TableEntry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TableEntry>_>_>
  ::map(&this->mTables);
  std::
  map<unsigned_short,_GlyphEntry_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_GlyphEntry_*>_>_>
  ::map(&this->mActualGlyphs);
  this->mHeaderOffset = 0;
  this->mTableOffset = 0;
  this->mHMtx = (HMtxTable)0x0;
  (this->mName).mNameEntries = (NameTableEntry *)0x0;
  this->mLoca = (LocaTable)0x0;
  this->mGlyf = (GlyfTable)0x0;
  return;
}

Assistant:

OpenTypeFileInput::OpenTypeFileInput(void)
{
    mHeaderOffset = 0;
    mTableOffset = 0;
	mHMtx = NULL;
	mName.mNameEntries = NULL;
	mLoca = NULL;
	mGlyf = NULL;
}